

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectGenericLoopSelSwitch<duckdb::interval_t,duckdb::interval_t,duckdb::NotEquals,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *lsel,SelectionVector *rsel,
                SelectionVector *result_sel,idx_t count,ValidityMask *lvalidity,
                ValidityMask *rvalidity,SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  ulong uVar4;
  idx_t iVar5;
  idx_t iVar6;
  idx_t iVar7;
  ulong uVar8;
  SelectionVector *pSVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long local_68;
  idx_t local_58;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      if (count == 0) {
        local_68 = 0;
      }
      else {
        psVar1 = result_sel->sel_vector;
        psVar2 = lsel->sel_vector;
        psVar3 = rsel->sel_vector;
        local_68 = 0;
        uVar11 = 0;
        do {
          uVar10 = uVar11;
          if (psVar1 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar1[uVar11];
          }
          uVar4 = uVar11;
          if (psVar2 != (sel_t *)0x0) {
            uVar4 = (ulong)psVar2[uVar11];
          }
          uVar8 = uVar11;
          if (psVar3 != (sel_t *)0x0) {
            uVar8 = (ulong)psVar3[uVar11];
          }
          if (((ldata[uVar4].months == rdata[uVar8].months) &&
              (ldata[uVar4].days == rdata[uVar8].days)) &&
             (ldata[uVar4].micros == rdata[uVar8].micros)) {
LAB_00f09e7e:
            false_sel->sel_vector[local_68] = (sel_t)uVar10;
            local_68 = local_68 + 1;
          }
          else {
            lVar12 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
            lVar13 = (long)rdata[uVar8].days + rdata[uVar8].micros / 86400000000;
            if ((((long)ldata[uVar4].months + lVar12 / 0x1e ==
                  (long)rdata[uVar8].months + lVar13 / 0x1e) && (lVar12 % 0x1e == lVar13 % 0x1e)) &&
               (ldata[uVar4].micros % 86400000000 == rdata[uVar8].micros % 86400000000))
            goto LAB_00f09e7e;
          }
          uVar11 = uVar11 + 1;
        } while (count != uVar11);
      }
      return count - local_68;
    }
    if (count != 0) {
      psVar1 = result_sel->sel_vector;
      psVar2 = lsel->sel_vector;
      psVar3 = rsel->sel_vector;
      iVar7 = 0;
      uVar11 = 0;
      do {
        uVar10 = uVar11;
        if (psVar1 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar1[uVar11];
        }
        uVar4 = uVar11;
        if (psVar2 != (sel_t *)0x0) {
          uVar4 = (ulong)psVar2[uVar11];
        }
        uVar8 = uVar11;
        if (psVar3 != (sel_t *)0x0) {
          uVar8 = (ulong)psVar3[uVar11];
        }
        if (((ldata[uVar4].months != rdata[uVar8].months) ||
            (ldata[uVar4].days != rdata[uVar8].days)) ||
           (ldata[uVar4].micros != rdata[uVar8].micros)) {
          lVar12 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
          lVar13 = (long)rdata[uVar8].days + rdata[uVar8].micros / 86400000000;
          if ((((long)ldata[uVar4].months + lVar12 / 0x1e !=
                (long)rdata[uVar8].months + lVar13 / 0x1e) || (lVar12 % 0x1e != lVar13 % 0x1e)) ||
             (ldata[uVar4].micros % 86400000000 != rdata[uVar8].micros % 86400000000)) {
            true_sel->sel_vector[iVar7] = (sel_t)uVar10;
            iVar7 = iVar7 + 1;
          }
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
      return iVar7;
    }
  }
  else if (count != 0) {
    psVar1 = result_sel->sel_vector;
    psVar2 = lsel->sel_vector;
    psVar3 = rsel->sel_vector;
    local_58 = 0;
    uVar11 = 0;
    iVar7 = 0;
    do {
      uVar10 = uVar11;
      if (psVar1 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar1[uVar11];
      }
      uVar4 = uVar11;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[uVar11];
      }
      uVar8 = uVar11;
      if (psVar3 != (sel_t *)0x0) {
        uVar8 = (ulong)psVar3[uVar11];
      }
      if (((ldata[uVar4].months == rdata[uVar8].months) && (ldata[uVar4].days == rdata[uVar8].days))
         && (ldata[uVar4].micros == rdata[uVar8].micros)) {
LAB_00f09b3e:
        iVar5 = local_58;
        iVar6 = iVar7;
        pSVar9 = false_sel;
        local_58 = local_58 + 1;
      }
      else {
        lVar12 = (long)ldata[uVar4].days + ldata[uVar4].micros / 86400000000;
        lVar13 = (long)rdata[uVar8].days + rdata[uVar8].micros / 86400000000;
        if ((((long)ldata[uVar4].months + lVar12 / 0x1e == (long)rdata[uVar8].months + lVar13 / 0x1e
             ) && (lVar12 % 0x1e == lVar13 % 0x1e)) &&
           (ldata[uVar4].micros % 86400000000 == rdata[uVar8].micros % 86400000000))
        goto LAB_00f09b3e;
        iVar6 = iVar7 + 1;
        iVar5 = iVar7;
        pSVar9 = true_sel;
      }
      pSVar9->sel_vector[iVar5] = (sel_t)uVar10;
      uVar11 = uVar11 + 1;
      iVar7 = iVar6;
      if (count == uVar11) {
        return iVar6;
      }
    } while( true );
  }
  return 0;
}

Assistant:

static inline idx_t
	SelectGenericLoopSelSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                           const SelectionVector *__restrict lsel, const SelectionVector *__restrict rsel,
	                           const SelectionVector *__restrict result_sel, idx_t count, ValidityMask &lvalidity,
	                           ValidityMask &rvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else if (true_sel) {
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, true, false>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectGenericLoop<LEFT_TYPE, RIGHT_TYPE, OP, NO_NULL, false, true>(
			    ldata, rdata, lsel, rsel, result_sel, count, lvalidity, rvalidity, true_sel, false_sel);
		}
	}